

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int check_trailing_bits_after_symbol_coder(aom_reader *r)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint8_t *puVar4;
  aom_reader *in_RDI;
  uint8_t *p_end;
  uint8_t pattern;
  uint8_t last_byte;
  uint8_t *p;
  uint32_t nb_bytes;
  uint32_t nb_bits;
  aom_reader *in_stack_ffffffffffffffd0;
  uint8_t *local_20;
  int local_4;
  
  iVar1 = aom_reader_has_overflowed(in_stack_ffffffffffffffd0);
  if (iVar1 == 0) {
    uVar2 = aom_reader_tell((aom_reader *)0x1a72cf);
    local_20 = aom_reader_find_begin(in_RDI);
    local_20 = local_20 + (uVar2 + 7 >> 3);
    uVar3 = 0x80 >> ((char)uVar2 - 1U & 7);
    if (((uint)local_20[-1] & (uVar3 & 0xff) * 2 - 1) == (uVar3 & 0xff)) {
      puVar4 = aom_reader_find_end(in_RDI);
      for (; local_20 < puVar4; local_20 = local_20 + 1) {
        if (*local_20 != '\0') {
          return -1;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int check_trailing_bits_after_symbol_coder(aom_reader *r) {
  if (aom_reader_has_overflowed(r)) return -1;

  uint32_t nb_bits = aom_reader_tell(r);
  uint32_t nb_bytes = (nb_bits + 7) >> 3;
  const uint8_t *p = aom_reader_find_begin(r) + nb_bytes;

  // aom_reader_tell() returns 1 for a newly initialized decoder, and the
  // return value only increases as values are decoded. So nb_bits > 0, and
  // thus p > p_begin. Therefore accessing p[-1] is safe.
  uint8_t last_byte = p[-1];
  uint8_t pattern = 128 >> ((nb_bits - 1) & 7);
  if ((last_byte & (2 * pattern - 1)) != pattern) return -1;

  // Make sure that all padding bytes are zero as required by the spec.
  const uint8_t *p_end = aom_reader_find_end(r);
  while (p < p_end) {
    if (*p != 0) return -1;
    p++;
  }
  return 0;
}